

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_generator.cc
# Opt level: O1

bool google::protobuf::compiler::objectivec::anon_unknown_3::StringToBool
               (string *value,bool *result)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  string upper_value;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  pcVar1 = (value->_M_dataplus)._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + value->_M_string_length);
  if (local_30 != 0) {
    lVar4 = 0;
    do {
      if ((byte)(local_38[lVar4] + 0x9f) < 0x1a) {
        local_38[lVar4] = local_38[lVar4] + -0x20;
      }
      lVar4 = lVar4 + 1;
    } while (local_30 != lVar4);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar3 == 0) {
    bVar2 = false;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar3 != 0) {
      bVar2 = false;
      goto LAB_0026dddf;
    }
    bVar2 = true;
  }
  *result = bVar2;
  bVar2 = true;
LAB_0026dddf:
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return bVar2;
}

Assistant:

bool StringToBool(const std::string& value, bool* result) {
  std::string upper_value(value);
  UpperString(&upper_value);
  if (upper_value == "NO") {
    *result = false;
    return true;
  }
  if (upper_value == "YES") {
    *result = true;
    return true;
  }

  return false;
}